

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTypeHandler.cpp
# Opt level: O0

void __thiscall
Js::DictionaryTypeHandlerBase<unsigned_short>::SetIsPrototype
          (DictionaryTypeHandlerBase<unsigned_short> *this,DynamicObject *instance)

{
  PropertyRecord *propertyRecord_00;
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  int iVar4;
  RecyclerWeakReference<Js::DynamicObject> **ppRVar5;
  RecyclerWeakReference<Js::DynamicObject> *pRVar6;
  DynamicObject *pDVar7;
  undefined4 *puVar8;
  DynamicType *oldType_00;
  RecyclerWeakReference<Js::DynamicObject> *ptr;
  BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *pBVar9;
  PropertyRecord **ppPVar10;
  DictionaryPropertyDescriptor<unsigned_short> *descriptor_00;
  DictionaryPropertyDescriptor<unsigned_short> *descriptor;
  PropertyRecord *propertyRecord;
  int i;
  bool hasNewType;
  RecyclerWeakReference<Js::DynamicObject> *oldSingletonInstance;
  DynamicType *oldType;
  anon_class_8_1_0902ba13 setFixedFlags;
  DynamicObject *instance_local;
  DictionaryTypeHandlerBase<unsigned_short> *this_local;
  
  setFixedFlags.instance = instance;
  bVar2 = DynamicTypeHandler::ChangeTypeOnProto();
  if ((bVar2) ||
     ((bVar2 = DynamicTypeHandler::GetIsOrMayBecomeShared(&this->super_DynamicTypeHandler), bVar2 &&
      (bVar2 = DynamicTypeHandler::IsolatePrototypes(), bVar2)))) {
    bVar2 = DynamicTypeHandler::GetIsOrMayBecomeShared(&this->super_DynamicTypeHandler);
    if (bVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                  ,0x93b,"(!GetIsOrMayBecomeShared())","!GetIsOrMayBecomeShared()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 0;
    }
    bVar2 = DynamicTypeHandler::GetIsShared(&this->super_DynamicTypeHandler);
    if ((bVar2) &&
       (ppRVar5 = Memory::WriteBarrierPtr::operator_cast_to_RecyclerWeakReference__
                            ((WriteBarrierPtr *)&this->singletonInstance),
       *ppRVar5 != (RecyclerWeakReference<Js::DynamicObject> *)0x0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                  ,0x93e,"(!GetIsShared() || this->singletonInstance == nullptr)",
                                  "!GetIsShared() || this->singletonInstance == nullptr");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 0;
    }
    ppRVar5 = Memory::WriteBarrierPtr::operator_cast_to_RecyclerWeakReference__
                        ((WriteBarrierPtr *)&this->singletonInstance);
    if (*ppRVar5 != (RecyclerWeakReference<Js::DynamicObject> *)0x0) {
      pRVar6 = Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::DynamicObject>_>::
               operator->(&this->singletonInstance);
      pDVar7 = Memory::RecyclerWeakReference<Js::DynamicObject>::Get(pRVar6);
      if (pDVar7 != setFixedFlags.instance) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                    ,0x93f,
                                    "(this->singletonInstance == nullptr || this->singletonInstance->Get() == instance)"
                                    ,
                                    "this->singletonInstance == nullptr || this->singletonInstance->Get() == instance"
                                   );
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 0;
      }
    }
    oldType = (DynamicType *)setFixedFlags.instance;
    oldType_00 = DynamicObject::GetDynamicType(setFixedFlags.instance);
    pRVar6 = GetSingletonInstance(this);
    TraceFixedFieldsBeforeSetIsProto
              (setFixedFlags.instance,&this->super_DynamicTypeHandler,oldType_00,pRVar6);
    propertyRecord._7_1_ = false;
    bVar2 = DynamicTypeHandler::ChangeTypeOnProto();
    if (bVar2) {
      DynamicObject::ChangeType(setFixedFlags.instance);
      bVar2 = DynamicObject::HasSharedType(setFixedFlags.instance);
      if (bVar2) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                    ,0x97e,"(!instance->HasSharedType())",
                                    "!instance->HasSharedType()");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 0;
      }
      propertyRecord._7_1_ = true;
    }
    bVar2 = ThreadContext::IsOnStack(setFixedFlags.instance);
    if (bVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                  ,0x983,"(!ThreadContext::IsOnStack(instance))",
                                  "!ThreadContext::IsOnStack(instance)");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 0;
    }
    bVar2 = DynamicTypeHandler::AreSingletonInstancesNeeded();
    if ((bVar2) &&
       (ppRVar5 = Memory::WriteBarrierPtr::operator_cast_to_RecyclerWeakReference__
                            ((WriteBarrierPtr *)&this->singletonInstance),
       *ppRVar5 == (RecyclerWeakReference<Js::DynamicObject> *)0x0)) {
      ptr = DynamicObject::CreateWeakReferenceToSelf(setFixedFlags.instance);
      Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::DynamicObject>_>::operator=
                (&this->singletonInstance,ptr);
    }
    BVar3 = RecyclableObject::IsExternal(&(setFixedFlags.instance)->super_RecyclableObject);
    if (BVar3 == 0) {
      propertyRecord._0_4_ = 0;
      while( true ) {
        pBVar9 = Memory::
                 WriteBarrierPtr<JsUtil::BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
                 ::operator->(&this->propertyMap);
        iVar4 = JsUtil::
                BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                ::Count(pBVar9);
        if (iVar4 <= (int)propertyRecord) break;
        pBVar9 = Memory::
                 WriteBarrierPtr<JsUtil::BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
                 ::operator->(&this->propertyMap);
        ppPVar10 = JsUtil::
                   BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                   ::GetKeyAt(pBVar9,(int)propertyRecord);
        propertyRecord_00 = *ppPVar10;
        pBVar9 = Memory::
                 WriteBarrierPtr<JsUtil::BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
                 ::operator->(&this->propertyMap);
        descriptor_00 =
             JsUtil::
             BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
             ::GetReferenceAt(pBVar9,(int)propertyRecord);
        SetIsPrototype::anon_class_8_1_0902ba13::operator()
                  ((anon_class_8_1_0902ba13 *)&oldType,propertyRecord_00,descriptor_00,
                   propertyRecord._7_1_);
        propertyRecord._0_4_ = (int)propertyRecord + 1;
      }
    }
    DynamicTypeHandler::SetFlags(&this->super_DynamicTypeHandler,' ');
    TraceFixedFieldsAfterSetIsProto
              (setFixedFlags.instance,&this->super_DynamicTypeHandler,
               &this->super_DynamicTypeHandler,oldType_00,pRVar6);
  }
  else {
    DynamicTypeHandler::SetFlags(&this->super_DynamicTypeHandler,' ');
  }
  return;
}

Assistant:

void DictionaryTypeHandlerBase<T>::SetIsPrototype(DynamicObject* instance)
    {
        // Don't return if IsPrototypeFlag is set, because we may still need to do a type transition and
        // set fixed bits.  If this handler were to be shared, this instance may not be a prototype yet.
        // We might need to convert to a non-shared type handler and/or change type.
        if (!ChangeTypeOnProto() && !(GetIsOrMayBecomeShared() && IsolatePrototypes()))
        {
            SetFlags(IsPrototypeFlag);
            return;
        }

        // DictionaryTypeHandlers are never shared. If we allow sharing, we will have to handle this case
        // just like SimpleDictionaryTypeHandler.
        Assert(!GetIsOrMayBecomeShared());

#if ENABLE_FIXED_FIELDS
        Assert(!GetIsShared() || this->singletonInstance == nullptr);
        Assert(this->singletonInstance == nullptr || this->singletonInstance->Get() == instance);

        // Review (jedmiad): Why isn't this getting inlined?
        const auto setFixedFlags = [instance](const PropertyRecord* propertyRecord, DictionaryPropertyDescriptor<T>* const descriptor, bool hasNewType)
        {
            if (IsInternalPropertyId(propertyRecord->GetPropertyId()))
            {
                return;
            }
            if (!(descriptor->Attributes & PropertyDeleted))
            {
                // See PathTypeHandlerBase::ConvertToSimpleDictionaryType for rules governing fixed field bits during type
                // handler transitions.  In addition, we know that the current instance is not yet a prototype.

                Assert(descriptor->SanityCheckFixedBits());
                if (descriptor->GetIsInitialized())
                {
                    // Since DictionaryTypeHandlers are never shared, we can set fixed fields and clear used as fixed as long
                    // as we have changed the type.  Otherwise populated load field caches would still be valid and would need
                    // to be explicitly invalidated if the property value changes.
                    if (hasNewType)
                    {
                        T dataSlot = descriptor->template GetDataPropertyIndex<false>();
                        if (dataSlot != NoSlots)
                        {
                            Var value = instance->GetSlot(dataSlot);
                            // Because DictionaryTypeHandlers are never shared we should always have a property value if the handler
                            // says it's initialized.
                            Assert(value != nullptr);
                            descriptor->SetIsFixed(VarIs<JavascriptFunction>(value) ? ShouldFixMethodProperties() : (ShouldFixDataProperties() && CheckHeuristicsForFixedDataProps(instance, propertyRecord, value)));
                        }
                        else if (descriptor->GetIsAccessor())
                        {
                            Assert(descriptor->GetGetterPropertyIndex() != NoSlots && descriptor->GetSetterPropertyIndex() != NoSlots);
                            descriptor->SetIsFixed(ShouldFixAccessorProperties());
                        }

                        // Since we have a new type we can clear all used as fixed bits.  That's because any instance field loads
                        // will have been invalidated by the type transition, and there are no proto fields loads from this object
                        // because it is just now becoming a proto.
                        descriptor->SetUsedAsFixed(false);
                    }
                }
                else
                {
                    Assert(!descriptor->GetIsFixed() && !descriptor->GetUsedAsFixed());
                }
                Assert(descriptor->SanityCheckFixedBits());
            }
        };

#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
        DynamicType* oldType = instance->GetDynamicType();
        RecyclerWeakReference<DynamicObject>* oldSingletonInstance = GetSingletonInstance();
        TraceFixedFieldsBeforeSetIsProto(instance, this, oldType, oldSingletonInstance);
#endif
#endif

        bool hasNewType = false;
        if (ChangeTypeOnProto())
        {
            // Forcing a type transition allows us to fix all fields (even those that were previously marked as non-fixed).
            instance->ChangeType();
            Assert(!instance->HasSharedType());
            hasNewType = true;
        }

        // Currently there is no way to become the prototype if you are a stack instance
        Assert(!ThreadContext::IsOnStack(instance));
#if ENABLE_FIXED_FIELDS
        if (AreSingletonInstancesNeeded() && this->singletonInstance == nullptr)
        {
            this->singletonInstance = instance->CreateWeakReferenceToSelf();
        }

        // We don't want fixed properties on external objects.  See DynamicObject::ResetObject for more information.
        if (!instance->IsExternal())
        {
            // The propertyMap dictionary is guaranteed to have contiguous entries because we never remove entries from it.
            for (int i = 0; i < propertyMap->Count(); i++)
            {
                const PropertyRecord* propertyRecord = propertyMap->GetKeyAt(i);
                DictionaryPropertyDescriptor<T>* const descriptor = propertyMap->GetReferenceAt(i);
                setFixedFlags(propertyRecord, descriptor, hasNewType);
            }
        }
#endif

        SetFlags(IsPrototypeFlag);

#if ENABLE_FIXED_FIELDS
#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
        TraceFixedFieldsAfterSetIsProto(instance, this, this, oldType, oldSingletonInstance);
#endif
#endif
    }